

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyShow.c
# Opt level: O2

void Ivy_ManShow(Ivy_Man_t *pMan,int fHaig,Vec_Ptr_t *vBold)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  FILE *pFVar5;
  void *pvVar6;
  char *pcVar7;
  uint *puVar8;
  uint *puVar9;
  int iVar10;
  uint uVar11;
  Vec_Ptr_t *p;
  char *pcVar12;
  uint *puVar13;
  uint uVar14;
  bool bVar15;
  char FileNameDot [200];
  
  Ivy_ManShow::Counter = Ivy_ManShow::Counter + 1;
  sprintf(FileNameDot,"temp%02d.dot");
  pFVar5 = fopen(FileNameDot,"w");
  if (pFVar5 == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
  }
  else {
    fclose(pFVar5);
    if (pMan->nObjs[6] + pMan->nObjs[5] < 0xc9) {
      pFVar5 = fopen(FileNameDot,"w");
      if (pFVar5 == (FILE *)0x0) {
        fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
      }
      else {
        if (vBold != (Vec_Ptr_t *)0x0) {
          for (iVar10 = 0; iVar10 < vBold->nSize; iVar10 = iVar10 + 1) {
            pvVar6 = Vec_PtrEntry(vBold,iVar10);
            *(byte *)((long)pvVar6 + 8) = *(byte *)((long)pvVar6 + 8) | 0x20;
          }
        }
        uVar3 = Ivy_ManSetLevels(pMan,fHaig);
        fprintf(pFVar5,"# %s\n","AIG structure generated by IVY package");
        fputc(10,pFVar5);
        fwrite("digraph AIG {\n",0xe,1,pFVar5);
        fwrite("size = \"7.5,10\";\n",0x11,1,pFVar5);
        fwrite("center = true;\n",0xf,1,pFVar5);
        fwrite("edge [dir = back];\n",0x13,1,pFVar5);
        fputc(10,pFVar5);
        fwrite("{\n",2,1,pFVar5);
        fwrite("  node [shape = plaintext];\n",0x1c,1,pFVar5);
        fwrite("  edge [style = invis];\n",0x18,1,pFVar5);
        fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,pFVar5);
        fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,pFVar5);
        uVar14 = uVar3 + 1;
        for (uVar11 = uVar14; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
          fprintf(pFVar5,"  Level%d",(ulong)uVar11);
          fwrite(" [label = ",10,1,pFVar5);
          fputc(0x22,pFVar5);
          fputc(0x22,pFVar5);
          fwrite("];\n",3,1,pFVar5);
        }
        fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,pFVar5);
        uVar11 = uVar14;
        while (-1 < (int)uVar11) {
          fprintf(pFVar5,"  Level%d",(ulong)uVar11);
          bVar15 = uVar11 == 0;
          uVar11 = uVar11 - 1;
          if (bVar15) {
            fputc(0x3b,pFVar5);
          }
          else {
            fwrite(" ->",3,1,pFVar5);
          }
        }
        fputc(10,pFVar5);
        fputc(0x7d,pFVar5);
        fputc(10,pFVar5);
        fputc(10,pFVar5);
        fwrite("{\n",2,1,pFVar5);
        fwrite("  rank = same;\n",0xf,1,pFVar5);
        fwrite("  LevelTitle1;\n",0xf,1,pFVar5);
        fwrite("  title1 [shape=plaintext,\n",0x1b,1,pFVar5);
        fwrite("          fontsize=20,\n",0x17,1,pFVar5);
        fwrite("          fontname = \"Times-Roman\",\n",0x24,1,pFVar5);
        fwrite("          label=\"",0x11,1,pFVar5);
        fputs("AIG structure visualized by ABC",pFVar5);
        fwrite("\\n",2,1,pFVar5);
        fprintf(pFVar5,"Benchmark \\\"%s\\\". ","aig");
        pcVar7 = Extra_TimeStamp();
        fprintf(pFVar5,"Time was %s. ",pcVar7);
        fwrite("\"\n",2,1,pFVar5);
        fwrite("         ];\n",0xc,1,pFVar5);
        fputc(0x7d,pFVar5);
        fputc(10,pFVar5);
        fputc(10,pFVar5);
        fwrite("{\n",2,1,pFVar5);
        fwrite("  rank = same;\n",0xf,1,pFVar5);
        fwrite("  LevelTitle2;\n",0xf,1,pFVar5);
        fwrite("  title2 [shape=plaintext,\n",0x1b,1,pFVar5);
        fwrite("          fontsize=18,\n",0x17,1,pFVar5);
        fwrite("          fontname = \"Times-Roman\",\n",0x24,1,pFVar5);
        fwrite("          label=\"",0x11,1,pFVar5);
        fprintf(pFVar5,"The set contains %d logic nodes and spans %d levels.",
                (ulong)(uint)(pMan->nObjs[6] + pMan->nObjs[5]),(ulong)uVar14);
        fwrite("\\n",2,1,pFVar5);
        fwrite("\"\n",2,1,pFVar5);
        fwrite("         ];\n",0xc,1,pFVar5);
        fputc(0x7d,pFVar5);
        fputc(10,pFVar5);
        fputc(10,pFVar5);
        fwrite("{\n",2,1,pFVar5);
        fwrite("  rank = same;\n",0xf,1,pFVar5);
        fprintf(pFVar5,"  Level%d;\n",(ulong)uVar14);
        for (iVar10 = 0; iVar10 < pMan->vObjs->nSize; iVar10 = iVar10 + 1) {
          puVar8 = (uint *)Vec_PtrEntry(pMan->vObjs,iVar10);
          if ((puVar8 != (uint *)0x0) && ((uVar11 = puVar8[2] & 0xf, uVar11 == 4 || (uVar11 == 2))))
          {
            if ((fHaig == 0) && (uVar1 = *(ulong *)(puVar8 + 0x12), uVar1 != 0)) {
              pcVar7 = "_in";
              if (uVar11 != 4) {
                pcVar7 = "";
              }
              pcVar12 = "";
              if ((uVar1 & 1) != 0) {
                pcVar12 = "\'";
              }
              fprintf(pFVar5,"  Node%d%s [label = \"%d%s(%d%s)\"",(ulong)*puVar8,pcVar7,
                      (ulong)*puVar8,pcVar7,(ulong)*(uint *)(uVar1 & 0xfffffffffffffffe),pcVar12);
            }
            else {
              pcVar7 = "_in";
              if (uVar11 != 4) {
                pcVar7 = "";
              }
              fprintf(pFVar5,"  Node%d%s [label = \"%d%s\"",(ulong)*puVar8,pcVar7,(ulong)*puVar8,
                      pcVar7);
            }
            pcVar7 = "box";
            if ((puVar8[2] & 0xf) != 4) {
              pcVar7 = "invtriangle";
            }
            fprintf(pFVar5,", shape = %s",pcVar7);
            fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar5);
            fwrite("];\n",3,1,pFVar5);
          }
        }
        fputc(0x7d,pFVar5);
        fputc(10,pFVar5);
        fputc(10,pFVar5);
        while( true ) {
          fwrite("{\n",2,1,pFVar5);
          fwrite("  rank = same;\n",0xf,1,pFVar5);
          if ((int)uVar3 < 1) break;
          fprintf(pFVar5,"  Level%d;\n",(ulong)uVar3);
          for (iVar10 = 0; iVar10 < pMan->vObjs->nSize; iVar10 = iVar10 + 1) {
            puVar8 = (uint *)Vec_PtrEntry(pMan->vObjs,iVar10);
            if ((puVar8 != (uint *)0x0) && (puVar8[2] >> 0xb == uVar3)) {
              if ((fHaig == 0) && (uVar1 = *(ulong *)(puVar8 + 0x12), uVar1 != 0)) {
                pcVar7 = "\'";
                if ((uVar1 & 1) == 0) {
                  pcVar7 = "";
                }
                fprintf(pFVar5,"  Node%d [label = \"%d(%d%s)\"",(ulong)*puVar8,(ulong)*puVar8,
                        (ulong)*(uint *)(uVar1 & 0xfffffffffffffffe),pcVar7);
              }
              else {
                fprintf(pFVar5,"  Node%d [label = \"%d\"",(ulong)*puVar8);
              }
              fwrite(", shape = ellipse",0x11,1,pFVar5);
              if ((vBold != (Vec_Ptr_t *)0x0) && ((puVar8[2] & 0x20) != 0)) {
                fwrite(", style = filled",0x10,1,pFVar5);
              }
              fwrite("];\n",3,1,pFVar5);
            }
          }
          fputc(0x7d,pFVar5);
          fputc(10,pFVar5);
          fputc(10,pFVar5);
          uVar3 = uVar3 - 1;
        }
        fprintf(pFVar5,"  Level%d;\n",0);
        if (0 < pMan->pConst1->nRefs) {
          fprintf(pFVar5,"  Node%d [label = \"Const1\"",(ulong)(uint)pMan->pConst1->Id);
          fwrite(", shape = ellipse",0x11,1,pFVar5);
          fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar5);
          fwrite("];\n",3,1,pFVar5);
        }
        for (iVar10 = 0; iVar10 < pMan->vObjs->nSize; iVar10 = iVar10 + 1) {
          puVar8 = (uint *)Vec_PtrEntry(pMan->vObjs,iVar10);
          if ((puVar8 != (uint *)0x0) && ((uVar11 = puVar8[2] & 0xf, uVar11 == 4 || (uVar11 == 1))))
          {
            if ((fHaig == 0) && (uVar1 = *(ulong *)(puVar8 + 0x12), uVar1 != 0)) {
              pcVar7 = "_out";
              if (uVar11 != 4) {
                pcVar7 = "";
              }
              pcVar12 = "";
              if ((uVar1 & 1) != 0) {
                pcVar12 = "\'";
              }
              fprintf(pFVar5,"  Node%d%s [label = \"%d%s(%d%s)\"",(ulong)*puVar8,pcVar7,
                      (ulong)*puVar8,pcVar7,(ulong)*(uint *)(uVar1 & 0xfffffffffffffffe),pcVar12);
            }
            else {
              pcVar7 = "_out";
              if (uVar11 != 4) {
                pcVar7 = "";
              }
              fprintf(pFVar5,"  Node%d%s [label = \"%d%s\"",(ulong)*puVar8,pcVar7,(ulong)*puVar8,
                      pcVar7);
            }
            pcVar7 = "box";
            if ((puVar8[2] & 0xf) != 4) {
              pcVar7 = "triangle";
            }
            fprintf(pFVar5,", shape = %s",pcVar7);
            fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar5);
            fwrite("];\n",3,1,pFVar5);
          }
        }
        fputc(0x7d,pFVar5);
        fputc(10,pFVar5);
        fputc(10,pFVar5);
        fwrite("title1 -> title2 [style = invis];\n",0x22,1,pFVar5);
        iVar10 = 0;
        while( true ) {
          p = pMan->vObjs;
          iVar4 = p->nSize;
          if (iVar4 <= iVar10) break;
          puVar8 = (uint *)Vec_PtrEntry(p,iVar10);
          if ((puVar8 != (uint *)0x0) && ((uVar11 = puVar8[2] & 0xf, uVar11 == 4 || (uVar11 == 2))))
          {
            pcVar7 = "_in";
            if (uVar11 != 4) {
              pcVar7 = "";
            }
            fprintf(pFVar5,"title2 -> Node%d%s [style = invis];\n",(ulong)*puVar8,pcVar7);
          }
          iVar10 = iVar10 + 1;
        }
        for (iVar10 = 0; iVar10 < iVar4; iVar10 = iVar10 + 1) {
          puVar8 = (uint *)Vec_PtrEntry(p,iVar10);
          if ((puVar8 != (uint *)0x0) &&
             ((uVar11 = puVar8[2] & 0xf, 0xfffffffd < uVar11 - 7 ||
              ((uVar11 < 8 && ((0x94U >> uVar11 & 1) != 0)))))) {
            pcVar7 = "";
            if (uVar11 == 4) {
              pcVar7 = "_in";
            }
            fprintf(pFVar5,"Node%d%s",(ulong)*puVar8,pcVar7);
            fwrite(" -> ",4,1,pFVar5);
            pcVar7 = "";
            if ((((uint *)(*(ulong *)(puVar8 + 4) & 0xfffffffffffffffe))[2] & 0xf) == 4) {
              pcVar7 = "_out";
            }
            fprintf(pFVar5,"Node%d%s",(ulong)*(uint *)(*(ulong *)(puVar8 + 4) & 0xfffffffffffffffe),
                    pcVar7);
            fwrite(" [",2,1,pFVar5);
            pcVar7 = "dotted";
            if ((puVar8[4] & 1) == 0) {
              pcVar7 = "bold";
            }
            fprintf(pFVar5,"style = %s",pcVar7);
            fputc(0x5d,pFVar5);
            fwrite(";\n",2,1,pFVar5);
            if (0xfffffffd < (puVar8[2] & 0xf) - 7) {
              fprintf(pFVar5,"Node%d",(ulong)*puVar8);
              fwrite(" -> ",4,1,pFVar5);
              pcVar7 = "";
              if ((((uint *)(*(ulong *)(puVar8 + 6) & 0xfffffffffffffffe))[2] & 0xf) == 4) {
                pcVar7 = "_out";
              }
              fprintf(pFVar5,"Node%d%s",
                      (ulong)*(uint *)(*(ulong *)(puVar8 + 6) & 0xfffffffffffffffe),pcVar7);
              fwrite(" [",2,1,pFVar5);
              pcVar7 = "dotted";
              if ((puVar8[6] & 1) == 0) {
                pcVar7 = "bold";
              }
              fprintf(pFVar5,"style = %s",pcVar7);
              fputc(0x5d,pFVar5);
              fwrite(";\n",2,1,pFVar5);
              if (((fHaig != 0) && (*(uint **)(puVar8 + 0x12) != (uint *)0x0)) &&
                 (puVar2 = *(uint **)(puVar8 + 0x12), puVar13 = puVar8, 0 < (int)puVar8[3])) {
                while( true ) {
                  puVar9 = puVar2;
                  fprintf(pFVar5,"Node%d",(ulong)*puVar13);
                  fwrite(" -> ",4,1,pFVar5);
                  if (puVar9 == puVar8) break;
                  fprintf(pFVar5,"Node%d",(ulong)*puVar9);
                  pcVar7 = "dotted";
                  if ((puVar9[0x12] & 1) == 0) {
                    pcVar7 = "bold";
                  }
                  fprintf(pFVar5," [style = %s]",pcVar7);
                  fwrite(";\n",2,1,pFVar5);
                  puVar2 = (uint *)(*(ulong *)(puVar9 + 0x12) & 0xfffffffffffffffe);
                  puVar13 = puVar9;
                }
                fprintf(pFVar5,"Node%d",(ulong)*puVar8);
                pcVar7 = "dotted";
                if ((puVar13[0x12] & 1) == 0) {
                  pcVar7 = "bold";
                }
                fprintf(pFVar5," [style = %s]",pcVar7);
                fwrite(";\n",2,1,pFVar5);
              }
            }
          }
          p = pMan->vObjs;
          iVar4 = p->nSize;
        }
        fputc(0x7d,pFVar5);
        fputc(10,pFVar5);
        fputc(10,pFVar5);
        fclose(pFVar5);
        if (vBold != (Vec_Ptr_t *)0x0) {
          for (iVar10 = 0; iVar10 < vBold->nSize; iVar10 = iVar10 + 1) {
            pvVar6 = Vec_PtrEntry(vBold,iVar10);
            *(byte *)((long)pvVar6 + 8) = *(byte *)((long)pvVar6 + 8) & 0xdf;
          }
        }
      }
    }
    else {
      fwrite("Cannot visualize AIG with more than 200 nodes.\n",0x2f,1,_stdout);
    }
    Abc_ShowFile(FileNameDot);
  }
  return;
}

Assistant:

void Ivy_ManShow( Ivy_Man_t * pMan, int fHaig, Vec_Ptr_t * vBold )
{
    extern void Abc_ShowFile( char * FileNameDot );
    static int Counter = 0;
    char FileNameDot[200];
    FILE * pFile;
    // create the file name
//    Ivy_ShowGetFileName( pMan->pName, FileNameDot );
    sprintf( FileNameDot, "temp%02d.dot", Counter++ );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    Ivy_WriteDotAig( pMan, FileNameDot, fHaig, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );
}